

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t archive_write_disk_set_group_lookup
                  (archive *_a,void *private_data,
                  _func_int64_t_void_ptr_char_ptr_int64_t *lookup_gid,
                  _func_void_void_ptr *cleanup_gid)

{
  int iVar1;
  wchar_t magic_test;
  archive_write_disk *a;
  _func_void_void_ptr *cleanup_gid_local;
  _func_int64_t_void_ptr_char_ptr_int64_t *lookup_gid_local;
  void *private_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_group_lookup");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if ((_a[1].error_string.length != 0) && (_a[1].error_string.buffer_length != 0)) {
      (*(code *)_a[1].error_string.length)(_a[1].error_string.buffer_length);
    }
    _a[1].error_string.s = (char *)lookup_gid;
    _a[1].error_string.length = (size_t)cleanup_gid;
    _a[1].error_string.buffer_length = (size_t)private_data;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_disk_set_group_lookup(struct archive *_a,
    void *private_data,
    int64_t (*lookup_gid)(void *private, const char *gname, int64_t gid),
    void (*cleanup_gid)(void *private))
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_group_lookup");

	if (a->cleanup_gid != NULL && a->lookup_gid_data != NULL)
		(a->cleanup_gid)(a->lookup_gid_data);

	a->lookup_gid = lookup_gid;
	a->cleanup_gid = cleanup_gid;
	a->lookup_gid_data = private_data;
	return (ARCHIVE_OK);
}